

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema.hpp
# Opt level: O2

json_uri * __thiscall
nlohmann::json_uri::append(json_uri *__return_storage_ptr__,json_uri *this,string *field)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = std::operator!=(&this->identifier_,"");
  json_uri(__return_storage_ptr__,this);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)field);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->pointer_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

json_uri append(const std::string &field) const
	{
		if (identifier_ != "")
			return *this;

		json_uri u = *this;
		u.pointer_ /= field;
		return u;
	}